

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_random.cpp
# Opt level: O3

void __thiscall FRandom::FRandom(FRandom *this,char *name)

{
  uint uVar1;
  size_t sVar2;
  FRandom *pFVar3;
  FRandom *pFVar4;
  FRandom **ppFVar5;
  uint uVar6;
  
  sVar2 = strlen(name);
  uVar1 = crc32(0,name,sVar2 & 0xffffffff);
  this->NameCRC = uVar1;
  this->initialized = false;
  this->Name = name;
  if (uVar1 == 0) {
    __assert_fail("NameCRC != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/m_random.cpp"
                  ,0xb2,"FRandom::FRandom(const char *)");
  }
  if (RNGList == (FRandom *)0x0) {
    ppFVar5 = &RNGList;
LAB_004f5fbf:
    pFVar4 = (FRandom *)0x0;
  }
  else {
    uVar6 = RNGList->NameCRC;
    pFVar4 = RNGList;
    if (uVar6 < uVar1) {
      do {
        pFVar3 = pFVar4;
        pFVar4 = pFVar3->Next;
        if (pFVar4 == (FRandom *)0x0) {
          ppFVar5 = &pFVar3->Next;
          goto LAB_004f5fbf;
        }
        uVar6 = pFVar4->NameCRC;
      } while (uVar6 < uVar1);
      ppFVar5 = &pFVar3->Next;
    }
    else {
      ppFVar5 = &RNGList;
    }
    if (uVar6 == uVar1) {
      __assert_fail("probe->NameCRC != NameCRC",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/m_random.cpp"
                    ,0xc4,"FRandom::FRandom(const char *)");
    }
  }
  this->Next = pFVar4;
  *ppFVar5 = this;
  return;
}

Assistant:

FRandom::FRandom (const char *name)
{
	NameCRC = CalcCRC32 ((const BYTE *)name, (unsigned int)strlen (name));
#ifndef NDEBUG
	initialized = false;
	Name = name;
	// A CRC of 0 is reserved for nameless RNGs that don't get stored
	// in savegames. The chance is very low that you would get a CRC of 0,
	// but it's still possible.
	assert (NameCRC != 0);
#endif

	// Insert the RNG in the list, sorted by CRC
	FRandom **prev = &RNGList, *probe = RNGList;

	while (probe != NULL && probe->NameCRC < NameCRC)
	{
		prev = &probe->Next;
		probe = probe->Next;
	}

#ifndef NDEBUG
	if (probe != NULL)
	{
		// Because RNGs are identified by their CRCs in save games,
		// no two RNGs can have names that hash to the same CRC.
		// Obviously, this means every RNG must have a unique name.
		assert (probe->NameCRC != NameCRC);
	}
#endif

	Next = probe;
	*prev = this;
}